

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void rhash_sha3_process_block(uint64_t *hash,uint64_t *block,size_t block_size)

{
  size_t block_size_local;
  uint64_t *block_local;
  uint64_t *hash_local;
  
  *hash = *block ^ *hash;
  hash[1] = block[1] ^ hash[1];
  hash[2] = block[2] ^ hash[2];
  hash[3] = block[3] ^ hash[3];
  hash[4] = block[4] ^ hash[4];
  hash[5] = block[5] ^ hash[5];
  hash[6] = block[6] ^ hash[6];
  hash[7] = block[7] ^ hash[7];
  hash[8] = block[8] ^ hash[8];
  if (0x48 < block_size) {
    hash[9] = block[9] ^ hash[9];
    hash[10] = block[10] ^ hash[10];
    hash[0xb] = block[0xb] ^ hash[0xb];
    hash[0xc] = block[0xc] ^ hash[0xc];
    if (0x68 < block_size) {
      hash[0xd] = block[0xd] ^ hash[0xd];
      hash[0xe] = block[0xe] ^ hash[0xe];
      hash[0xf] = block[0xf] ^ hash[0xf];
      hash[0x10] = block[0x10] ^ hash[0x10];
      if (0x88 < block_size) {
        hash[0x11] = block[0x11] ^ hash[0x11];
      }
    }
  }
  rhash_sha3_permutation(hash);
  return;
}

Assistant:

static void rhash_sha3_process_block(uint64_t hash[25], const uint64_t* block, size_t block_size)
{
	/* expanded loop */
	hash[ 0] ^= le2me_64(block[ 0]);
	hash[ 1] ^= le2me_64(block[ 1]);
	hash[ 2] ^= le2me_64(block[ 2]);
	hash[ 3] ^= le2me_64(block[ 3]);
	hash[ 4] ^= le2me_64(block[ 4]);
	hash[ 5] ^= le2me_64(block[ 5]);
	hash[ 6] ^= le2me_64(block[ 6]);
	hash[ 7] ^= le2me_64(block[ 7]);
	hash[ 8] ^= le2me_64(block[ 8]);
	/* if not sha3-512 */
	if (block_size > 72) {
		hash[ 9] ^= le2me_64(block[ 9]);
		hash[10] ^= le2me_64(block[10]);
		hash[11] ^= le2me_64(block[11]);
		hash[12] ^= le2me_64(block[12]);
		/* if not sha3-384 */
		if (block_size > 104) {
			hash[13] ^= le2me_64(block[13]);
			hash[14] ^= le2me_64(block[14]);
			hash[15] ^= le2me_64(block[15]);
			hash[16] ^= le2me_64(block[16]);
			/* if not sha3-256 */
			if (block_size > 136) {
				hash[17] ^= le2me_64(block[17]);
#ifdef FULL_SHA3_FAMILY_SUPPORT
				/* if not sha3-224 */
				if (block_size > 144) {
					hash[18] ^= le2me_64(block[18]);
					hash[19] ^= le2me_64(block[19]);
					hash[20] ^= le2me_64(block[20]);
					hash[21] ^= le2me_64(block[21]);
					hash[22] ^= le2me_64(block[22]);
					hash[23] ^= le2me_64(block[23]);
					hash[24] ^= le2me_64(block[24]);
				}
#endif
			}
		}
	}
	/* make a permutation of the hash */
	rhash_sha3_permutation(hash);
}